

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O3

int hostkey_method_ssh_rsa_sha2_256_signv
              (LIBSSH2_SESSION *session,uchar **signature,size_t *signature_len,int veccount,
              iovec *datavec,void **abstract)

{
  RSA *rsactx;
  int iVar1;
  long lVar2;
  EVP_MD_CTX *ctx;
  uchar hash [32];
  EVP_MD_CTX *local_68;
  size_t *local_60;
  uchar local_58 [40];
  
  rsactx = (RSA *)*abstract;
  iVar1 = _libssh2_sha256_init((EVP_MD_CTX **)&local_68);
  if (iVar1 == 0) {
    iVar1 = -1;
  }
  else {
    local_60 = signature_len;
    if (0 < veccount) {
      lVar2 = 0;
      do {
        EVP_DigestUpdate(local_68,*(void **)((long)&datavec->iov_base + lVar2),
                         *(size_t *)((long)&datavec->iov_len + lVar2));
        lVar2 = lVar2 + 0x10;
      } while ((ulong)(uint)veccount << 4 != lVar2);
    }
    EVP_DigestFinal(local_68,local_58,(uint *)0x0);
    EVP_MD_CTX_free(local_68);
    iVar1 = _libssh2_rsa_sha2_sign(session,rsactx,local_58,0x20,signature,local_60);
    iVar1 = -(uint)(iVar1 != 0);
  }
  return iVar1;
}

Assistant:

static int
hostkey_method_ssh_rsa_sha2_256_signv(LIBSSH2_SESSION * session,
                                      unsigned char **signature,
                                      size_t *signature_len,
                                      int veccount,
                                      const struct iovec datavec[],
                                      void **abstract)
{
    libssh2_rsa_ctx *rsactx = (libssh2_rsa_ctx *) (*abstract);

#ifdef _libssh2_rsa_sha2_256_signv
    return _libssh2_rsa_sha2_256_signv(session, signature, signature_len,
                                       veccount, datavec, rsactx);
#else
    int ret;
    int i;
    unsigned char hash[SHA256_DIGEST_LENGTH];
    libssh2_sha256_ctx ctx;

    if(!libssh2_sha256_init(&ctx)) {
        return -1;
    }
    for(i = 0; i < veccount; i++) {
        libssh2_sha256_update(ctx, datavec[i].iov_base, datavec[i].iov_len);
    }
    libssh2_sha256_final(ctx, hash);

    ret = _libssh2_rsa_sha2_sign(session, rsactx, hash, SHA256_DIGEST_LENGTH,
                                 signature, signature_len);
    if(ret) {
        return -1;
    }

    return 0;
#endif
}